

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *key_00;
  string *input_00;
  string *output_00;
  allocator<char> local_181;
  string input;
  string key;
  string output;
  string enc_dec;
  string s;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (argc < 5) {
    usage();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&enc_dec,argv[1],(allocator<char> *)&key);
  bVar1 = std::operator!=(&enc_dec,"-e");
  if ((bVar1) && (bVar1 = std::operator!=(&enc_dec,"-d"), bVar1)) {
    usage();
    iVar2 = 2;
    goto LAB_00102c02;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key,argv[2],(allocator<char> *)&input);
  if (key._M_string_length == 8) {
    input._M_dataplus._M_p = (pointer)&input.field_2;
    input._M_string_length = 0;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    input.field_2._M_local_buf[0] = '\0';
    output.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&input);
    std::__cxx11::string::assign((char *)&output);
    if (argc != 5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&s,argv[5],&local_181);
      bVar1 = std::operator==(&s,"-s");
      if (bVar1) {
        s_showMessage = 1;
      }
      std::__cxx11::string::~string((string *)&s);
    }
    bVar1 = std::operator==(&enc_dec,"-e");
    if (bVar1) {
      key_00 = &local_40;
      std::__cxx11::string::string((string *)key_00,(string *)&key);
      input_00 = &local_60;
      std::__cxx11::string::string((string *)input_00,(string *)&input);
      output_00 = &local_80;
      std::__cxx11::string::string((string *)output_00,(string *)&output);
      iVar2 = encrypt_decrypt(key_00,input_00,output_00,0);
LAB_00102bca:
      std::__cxx11::string::~string((string *)output_00);
      std::__cxx11::string::~string((string *)input_00);
      std::__cxx11::string::~string((string *)key_00);
    }
    else {
      bVar1 = std::operator==(&enc_dec,"-d");
      iVar2 = 0;
      if (bVar1) {
        key_00 = &local_a0;
        std::__cxx11::string::string((string *)key_00,(string *)&key);
        input_00 = &local_c0;
        std::__cxx11::string::string((string *)input_00,(string *)&input);
        output_00 = &local_e0;
        std::__cxx11::string::string((string *)output_00,(string *)&output);
        iVar2 = encrypt_decrypt(key_00,input_00,output_00,1);
        goto LAB_00102bca;
      }
    }
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
  }
  else {
    usage();
    iVar2 = 2;
  }
  std::__cxx11::string::~string((string *)&key);
LAB_00102c02:
  std::__cxx11::string::~string((string *)&enc_dec);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{

	if (argc < 5)
	{
		usage();
		return 1;
	}

	string enc_dec = argv[1];
	if (enc_dec != "-e" && enc_dec != "-d")
	{
		usage();
		return 2;
	}

	string key = argv[2];
	if (key.size() != 8)
	{
		usage();
		return 2;
	}

	string input, output;
	if (argc > 3)
		input = argv[3];
	if (argc > 4)
		output = argv[4];

	if (argc > 5)
	{
		string s = argv[5];
		if (s == "-s")
			s_showMessage = false;
	}


	assert(sizeof(uint64_t) == 8);

	//    string key = "8654321";
	//    string enc_dec = "-e";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string enc_dec = "-d";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des.7z";

	if (enc_dec == "-e")
		return encrypt_decrypt(key, input, output, 0);
	if (enc_dec == "-d")
		return encrypt_decrypt(key, input, output, 1);

	return 0;
}